

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImRect ImGui::ShowMetricsWindow::Funcs::GetTableRect(ImGuiTable *table,int rect_type,int n)

{
  ImRect IVar1;
  ImGuiTableColumn *pIVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  ImGuiTableColumn *c_6;
  ImGuiTableColumn *c_5;
  ImGuiTableColumn *c_4;
  ImGuiTableColumn *c_3;
  ImGuiTableColumn *c_2;
  ImGuiTableColumn *c_1;
  ImGuiTableColumn *c;
  ImRect *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  ImRect *in_stack_ffffffffffffffc0;
  ImVec2 local_10;
  ImVec2 local_8;
  
  if (in_ESI == 0) {
    local_10 = *(ImVec2 *)(in_RDI + 0xf4);
    local_8 = *(ImVec2 *)(in_RDI + 0xfc);
  }
  else if (in_ESI == 1) {
    local_10 = *(ImVec2 *)(in_RDI + 0x104);
    local_8 = *(ImVec2 *)(in_RDI + 0x10c);
  }
  else if (in_ESI == 2) {
    local_10 = *(ImVec2 *)(in_RDI + 0x114);
    local_8 = *(ImVec2 *)(in_RDI + 0x11c);
  }
  else if (in_ESI == 3) {
    local_10 = *(ImVec2 *)(in_RDI + 0x164);
    local_8 = *(ImVec2 *)(in_RDI + 0x16c);
  }
  else if (in_ESI == 4) {
    local_10 = *(ImVec2 *)(in_RDI + 0x124);
    local_8 = *(ImVec2 *)(in_RDI + 300);
  }
  else if (in_ESI == 5) {
    local_10 = *(ImVec2 *)(in_RDI + 0x134);
    local_8 = *(ImVec2 *)(in_RDI + 0x13c);
  }
  else if (in_ESI == 6) {
    ImSpan<ImGuiTableColumn>::operator[]((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),in_EDX);
    ImRect::ImRect(in_stack_ffffffffffffffc0,(float)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (float)in_stack_ffffffffffffffb8,
                   (float)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                   SUB84(in_stack_ffffffffffffffb0,0));
  }
  else if (in_ESI == 7) {
    ImSpan<ImGuiTableColumn>::operator[]((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),in_EDX);
    ImRect::ImRect(in_stack_ffffffffffffffc0,(float)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (float)in_stack_ffffffffffffffb8,
                   (float)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                   SUB84(in_stack_ffffffffffffffb0,0));
  }
  else if (in_ESI == 8) {
    pIVar2 = ImSpan<ImGuiTableColumn>::operator[]
                       ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),in_EDX);
    local_10 = (pIVar2->ClipRect).Min;
    local_8 = (pIVar2->ClipRect).Max;
  }
  else if (in_ESI == 9) {
    pIVar2 = ImSpan<ImGuiTableColumn>::operator[]
                       ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),in_EDX);
    ImRect::ImRect((ImRect *)pIVar2,(float)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (float)in_stack_ffffffffffffffb8,
                   (float)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                   SUB84(in_stack_ffffffffffffffb0,0));
  }
  else if (in_ESI == 10) {
    pIVar2 = ImSpan<ImGuiTableColumn>::operator[]
                       ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),in_EDX);
    ImRect::ImRect(in_stack_ffffffffffffffc0,(float)((ulong)pIVar2 >> 0x20),SUB84(pIVar2,0),
                   (float)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                   SUB84(in_stack_ffffffffffffffb0,0));
  }
  else if (in_ESI == 0xb) {
    pIVar2 = ImSpan<ImGuiTableColumn>::operator[]
                       ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),in_EDX);
    ImRect::ImRect(in_stack_ffffffffffffffc0,(float)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (float)in_stack_ffffffffffffffb8,(float)((ulong)pIVar2 >> 0x20),SUB84(pIVar2,0));
  }
  else if (in_ESI == 0xc) {
    ImSpan<ImGuiTableColumn>::operator[]((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),in_EDX);
    ImRect::ImRect(in_stack_ffffffffffffffc0,(float)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (float)in_stack_ffffffffffffffb8,
                   (float)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                   SUB84(in_stack_ffffffffffffffb0,0));
  }
  else {
    ImRect::ImRect(in_stack_ffffffffffffffb0);
  }
  IVar1.Max = local_8;
  IVar1.Min = local_10;
  return IVar1;
}

Assistant:

static ImRect GetTableRect(ImGuiTable* table, int rect_type, int n)
        {
            if (rect_type == TRT_OuterRect)                     { return table->OuterRect; }
            else if (rect_type == TRT_InnerRect)                { return table->InnerRect; }
            else if (rect_type == TRT_WorkRect)                 { return table->WorkRect; }
            else if (rect_type == TRT_HostClipRect)             { return table->HostClipRect; }
            else if (rect_type == TRT_InnerClipRect)            { return table->InnerClipRect; }
            else if (rect_type == TRT_BackgroundClipRect)       { return table->BgClipRect; }
            else if (rect_type == TRT_ColumnsRect)              { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->MinX, table->InnerClipRect.Min.y, c->MaxX, table->InnerClipRect.Min.y + table->LastOuterHeight); }
            else if (rect_type == TRT_ColumnsWorkRect)          { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->WorkRect.Min.y, c->WorkMaxX, table->WorkRect.Max.y); }
            else if (rect_type == TRT_ColumnsClipRect)          { ImGuiTableColumn* c = &table->Columns[n]; return c->ClipRect; }
            else if (rect_type == TRT_ColumnsContentHeadersUsed){ ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersUsed, table->InnerClipRect.Min.y + table->LastFirstRowHeight); } // Note: y1/y2 not always accurate
            else if (rect_type == TRT_ColumnsContentHeadersIdeal){ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersIdeal, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentFrozen)     { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXFrozen, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentUnfrozen)   { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y + table->LastFirstRowHeight, c->ContentMaxXUnfrozen, table->InnerClipRect.Max.y); }
            IM_ASSERT(0);
            return ImRect();
        }